

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

bool AdditionHelper<long,_int,_10>::Addition(long *lhs,int *rhs,long *result)

{
  int iVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  
  lVar2 = *lhs;
  iVar1 = *rhs;
  lVar3 = iVar1 + lVar2;
  if (lVar2 < 0) {
    bVar5 = iVar1 < 0;
    bVar4 = lVar2 < lVar3;
  }
  else {
    bVar5 = -1 < iVar1;
    bVar4 = lVar3 < lVar2;
  }
  if ((bool)(bVar5 & bVar4)) {
    return false;
  }
  *result = lVar3;
  return true;
}

Assistant:

static bool Addition( const T& lhs, const U& rhs, T& result ) SAFEINT_NOTHROW
    {
        // lhs is std::int64_t, rhs signed
        std::int64_t tmp = (std::int64_t)((std::uint64_t)lhs + (std::uint64_t)rhs);

        if( lhs >= 0 )
        {
            // mixed sign cannot overflow
            if( rhs >= 0 && tmp < lhs )
                return false;
        }
        else
        {
            // lhs negative
            if( rhs < 0 && tmp > lhs )
                return false;
        }

        result = (T)tmp;
        return true;
    }